

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_collapse_rail.cpp
# Opt level: O0

void Omega_h::choose_rails
               (Mesh *mesh,LOs *cands2edges,Read<signed_char> *cand_edge_codes,
               Reals *cand_edge_quals,Read<signed_char> *verts_are_cands,Reals *vert_quals,
               Read<long> *vert_rails)

{
  Omega_h_Parting OVar1;
  LO LVar2;
  Int ent_dim;
  Read<long> local_310;
  undefined1 local_300 [64];
  undefined1 local_2c0 [64];
  undefined1 local_280 [48];
  undefined1 local_250 [8];
  type f;
  string local_198 [32];
  undefined1 local_178 [8];
  Write<long> vert_rails_w;
  string local_160 [32];
  undefined1 local_140 [8];
  Write<double> vert_quals_w;
  string local_128 [32];
  undefined1 local_108 [8];
  Write<signed_char> verts_are_cands_w;
  Read<long> globals;
  Reals lengths;
  LOs ev2v;
  Read<signed_char> ve_codes;
  LOs ve2e;
  LOs v2ve;
  Adj v2e;
  Read<int> local_58;
  undefined1 local_48 [8];
  LOs edges2cands;
  Reals *vert_quals_local;
  Read<signed_char> *verts_are_cands_local;
  Reals *cand_edge_quals_local;
  Read<signed_char> *cand_edge_codes_local;
  LOs *cands2edges_local;
  Mesh *mesh_local;
  
  edges2cands.write_.shared_alloc_.direct_ptr = vert_quals;
  OVar1 = Mesh::parting(mesh);
  if (OVar1 == OMEGA_H_GHOSTED) {
    Read<int>::Read(&local_58,cands2edges);
    LVar2 = Mesh::nedges(mesh);
    invert_injective_map((Omega_h *)local_48,&local_58,LVar2);
    Read<int>::~Read(&local_58);
    Mesh::ask_up((Adj *)&v2ve.write_.shared_alloc_.direct_ptr,mesh,0,1);
    Read<int>::Read((Read<int> *)&ve2e.write_.shared_alloc_.direct_ptr,
                    (Read<int> *)&v2ve.write_.shared_alloc_.direct_ptr);
    Read<int>::Read((Read<int> *)&ve_codes.write_.shared_alloc_.direct_ptr,
                    (Read<int> *)&v2e.super_Graph.a2ab.write_.shared_alloc_.direct_ptr);
    Read<signed_char>::Read
              ((Read<signed_char> *)&ev2v.write_.shared_alloc_.direct_ptr,
               (Read<signed_char> *)&v2e.super_Graph.ab2b.write_.shared_alloc_.direct_ptr);
    ent_dim = (Int)mesh;
    Mesh::ask_verts_of((Mesh *)&lengths.write_.shared_alloc_.direct_ptr,ent_dim);
    Mesh::ask_lengths((Mesh *)&globals.write_.shared_alloc_.direct_ptr);
    Mesh::globals((Mesh *)&verts_are_cands_w.shared_alloc_.direct_ptr,ent_dim);
    LVar2 = Mesh::nverts(mesh);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_128,"",(allocator *)((long)&vert_quals_w.shared_alloc_.direct_ptr + 7));
    Write<signed_char>::Write((Write<signed_char> *)local_108,LVar2,(string *)local_128);
    std::__cxx11::string::~string(local_128);
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)&vert_quals_w.shared_alloc_.direct_ptr + 7));
    LVar2 = Mesh::nverts(mesh);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_160,"",(allocator *)((long)&vert_rails_w.shared_alloc_.direct_ptr + 7));
    Write<double>::Write((Write<double> *)local_140,LVar2,(string *)local_160);
    std::__cxx11::string::~string(local_160);
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)&vert_rails_w.shared_alloc_.direct_ptr + 7));
    LVar2 = Mesh::nverts(mesh);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_198,"",(allocator *)((long)&f.vert_rails_w.shared_alloc_.direct_ptr + 7));
    Write<long>::Write((Write<long> *)local_178,LVar2,(string *)local_198);
    std::__cxx11::string::~string(local_198);
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)&f.vert_rails_w.shared_alloc_.direct_ptr + 7));
    Read<int>::Read((Read<int> *)local_250,(Read<int> *)&ve2e.write_.shared_alloc_.direct_ptr);
    Read<int>::Read((Read<int> *)&f.v2ve.write_.shared_alloc_.direct_ptr,
                    (Read<int> *)&ve_codes.write_.shared_alloc_.direct_ptr);
    Read<int>::Read((Read<int> *)&f.ve2e.write_.shared_alloc_.direct_ptr,(Read<int> *)local_48);
    Read<signed_char>::Read
              ((Read<signed_char> *)&f.edges2cands.write_.shared_alloc_.direct_ptr,
               (Read<signed_char> *)&ev2v.write_.shared_alloc_.direct_ptr);
    Read<signed_char>::Read
              ((Read<signed_char> *)&f.ve_codes.write_.shared_alloc_.direct_ptr,cand_edge_codes);
    Read<long>::Read((Read<long> *)&f.cand_edge_codes.write_.shared_alloc_.direct_ptr,
                     (Read<int> *)&verts_are_cands_w.shared_alloc_.direct_ptr);
    Read<double>::Read((Read<double> *)&f.globals.write_.shared_alloc_.direct_ptr,
                       (Read<double> *)&globals.write_.shared_alloc_.direct_ptr);
    Read<double>::Read((Read<double> *)&f.lengths.write_.shared_alloc_.direct_ptr,cand_edge_quals);
    Write<signed_char>::Write
              ((Write<signed_char> *)&f.cand_edge_quals.write_.shared_alloc_.direct_ptr,
               (Write<signed_char> *)local_108);
    Write<double>::Write
              ((Write<double> *)&f.verts_are_cands_w.shared_alloc_.direct_ptr,
               (Write<double> *)local_140);
    Write<long>::Write((Write<long> *)&f.vert_quals_w.shared_alloc_.direct_ptr,
                       (Write<int> *)local_178);
    LVar2 = Mesh::nverts(mesh);
    parallel_for<Omega_h::choose_rails(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>,Omega_h::Read<double>,Omega_h::Read<signed_char>*,Omega_h::Read<double>*,Omega_h::Read<long>*)::__0>
              (LVar2,(type *)local_250,"choose_rails");
    Write<signed_char>::Write
              ((Write<signed_char> *)(local_280 + 0x10),(Write<signed_char> *)local_108);
    Read<signed_char>::Read
              ((Read<signed_char> *)(local_280 + 0x20),(Write<signed_char> *)(local_280 + 0x10));
    Read<signed_char>::operator=(verts_are_cands,(Read<signed_char> *)(local_280 + 0x20));
    Read<signed_char>::~Read((Read<signed_char> *)(local_280 + 0x20));
    Write<signed_char>::~Write((Write<signed_char> *)(local_280 + 0x10));
    Read<signed_char>::Read((Read<signed_char> *)(local_2c0 + 0x30),verts_are_cands);
    Mesh::sync_array<signed_char>
              ((Mesh *)local_280,ent_dim,(Read<signed_char> *)0x0,(int)local_2c0 + 0x30);
    Read<signed_char>::operator=(verts_are_cands,(Read<signed_char> *)local_280);
    Read<signed_char>::~Read((Read<signed_char> *)local_280);
    Read<signed_char>::~Read((Read<signed_char> *)(local_2c0 + 0x30));
    Write<double>::Write((Write<double> *)(local_2c0 + 0x10),(Write<double> *)local_140);
    Read<double>::Read((Read<double> *)(local_2c0 + 0x20),(Write<double> *)(local_2c0 + 0x10));
    Read<double>::operator=
              ((Read<double> *)edges2cands.write_.shared_alloc_.direct_ptr,
               (Read<double> *)(local_2c0 + 0x20));
    Read<double>::~Read((Read<double> *)(local_2c0 + 0x20));
    Write<double>::~Write((Write<double> *)(local_2c0 + 0x10));
    Read<double>::Read((Read<double> *)(local_300 + 0x30),
                       (Read<double> *)edges2cands.write_.shared_alloc_.direct_ptr);
    Mesh::sync_array<double>((Mesh *)local_2c0,ent_dim,(Read<double> *)0x0,(int)local_300 + 0x30);
    Read<double>::operator=
              ((Read<double> *)edges2cands.write_.shared_alloc_.direct_ptr,(Read<double> *)local_2c0
              );
    Read<double>::~Read((Read<double> *)local_2c0);
    Read<double>::~Read((Read<double> *)(local_300 + 0x30));
    Write<long>::Write((Write<long> *)(local_300 + 0x10),(Write<int> *)local_178);
    Read<long>::Read((Read<long> *)(local_300 + 0x20),(Write<long> *)(local_300 + 0x10));
    Read<long>::operator=(vert_rails,(Read<long> *)(local_300 + 0x20));
    Read<long>::~Read((Read<long> *)(local_300 + 0x20));
    Write<long>::~Write((Write<long> *)(local_300 + 0x10));
    Read<long>::Read(&local_310,(Read<int> *)vert_rails);
    Mesh::sync_array<long>((Mesh *)local_300,ent_dim,(Read<long> *)0x0,(Int)&local_310);
    Read<long>::operator=(vert_rails,(Read<long> *)local_300);
    Read<long>::~Read((Read<long> *)local_300);
    Read<long>::~Read(&local_310);
    choose_rails(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>,Omega_h::Read<double>,Omega_h::Read<signed_char>*,Omega_h::Read<double>*,Omega_h::Read<long>*)
    ::$_0::~__0((__0 *)local_250);
    Write<long>::~Write((Write<long> *)local_178);
    Write<double>::~Write((Write<double> *)local_140);
    Write<signed_char>::~Write((Write<signed_char> *)local_108);
    Read<long>::~Read((Read<long> *)&verts_are_cands_w.shared_alloc_.direct_ptr);
    Read<double>::~Read((Read<double> *)&globals.write_.shared_alloc_.direct_ptr);
    Read<int>::~Read((Read<int> *)&lengths.write_.shared_alloc_.direct_ptr);
    Read<signed_char>::~Read((Read<signed_char> *)&ev2v.write_.shared_alloc_.direct_ptr);
    Read<int>::~Read((Read<int> *)&ve_codes.write_.shared_alloc_.direct_ptr);
    Read<int>::~Read((Read<int> *)&ve2e.write_.shared_alloc_.direct_ptr);
    Adj::~Adj((Adj *)&v2ve.write_.shared_alloc_.direct_ptr);
    Read<int>::~Read((Read<int> *)local_48);
    return;
  }
  fail("assertion %s failed at %s +%d\n","mesh->parting() == OMEGA_H_GHOSTED",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_collapse_rail.cpp"
       ,0x12);
}

Assistant:

void choose_rails(Mesh* mesh, LOs cands2edges, Read<I8> cand_edge_codes,
    Reals cand_edge_quals, Read<I8>* verts_are_cands, Reals* vert_quals,
    Read<GO>* vert_rails) {
  OMEGA_H_CHECK(mesh->parting() == OMEGA_H_GHOSTED);
  auto edges2cands = invert_injective_map(cands2edges, mesh->nedges());
  auto v2e = mesh->ask_up(VERT, EDGE);
  auto v2ve = v2e.a2ab;
  auto ve2e = v2e.ab2b;
  auto ve_codes = v2e.codes;
  auto ev2v = mesh->ask_verts_of(EDGE);
  auto lengths = mesh->ask_lengths();
  auto globals = mesh->globals(EDGE);
  auto verts_are_cands_w = Write<I8>(mesh->nverts());
  auto vert_quals_w = Write<Real>(mesh->nverts());
  auto vert_rails_w = Write<GO>(mesh->nverts());
  auto f = OMEGA_H_LAMBDA(LO v) {
    bool vert_is_cand = false;
    GO best_global = -1;
    Real best_length = -1;
    Real best_qual = -1;
    for (auto ve = v2ve[v]; ve < v2ve[v + 1]; ++ve) {
      auto e = ve2e[ve];
      auto cand = edges2cands[e];
      if (cand == -1) continue;
      auto ve_code = ve_codes[ve];
      auto eev = code_which_down(ve_code);
      auto cand_code = cand_edge_codes[cand];
      OMEGA_H_CHECK(cand_code != DONT_COLLAPSE);
      if (!collapses(cand_code, eev)) continue;
      auto global = globals[e];
      auto length = lengths[e];
      auto qual = cand_edge_quals[cand * 2 + eev];
      if ((best_global == -1) || (length < best_length) ||
          ((length == best_length) && (qual > best_qual))) {
        vert_is_cand = true;
        best_global = global;
        best_length = length;
        best_qual = qual;
      }
    }
    verts_are_cands_w[v] = vert_is_cand;
    if (vert_is_cand) OMEGA_H_CHECK(best_global != -1);
    vert_quals_w[v] = best_qual;
    vert_rails_w[v] = best_global;
  };
  parallel_for(mesh->nverts(), f, "choose_rails");
  *verts_are_cands = verts_are_cands_w;
  *verts_are_cands = mesh->sync_array(VERT, *verts_are_cands, 1);
  *vert_quals = vert_quals_w;
  *vert_quals = mesh->sync_array(VERT, *vert_quals, 1);
  *vert_rails = vert_rails_w;
  *vert_rails = mesh->sync_array(VERT, *vert_rails, 1);
}